

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O3

int Sfm_LibImplementGatesArea
              (Sfm_Lib_t *p,int *pFanins,int nFanins,int iObj,Vec_Int_t *vGates,Vec_Wec_t *vFanins)

{
  char cVar1;
  char cVar2;
  Mio_Cell2_t *pMVar3;
  Sfm_Fun_t *pSVar4;
  long lVar5;
  int iVar6;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar7;
  Vec_Int_t *pVVar8;
  Mio_Cell2_t *pMVar9;
  ulong uVar10;
  
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  pMVar3 = p->pCells;
  pSVar4 = p->pObjs;
  cVar1 = pSVar4[iObj].pFansB[0];
  cVar2 = pSVar4[iObj].pFansT[0];
  pMVar7 = Mio_LibraryReadGateByName(pLib,pMVar3[cVar1].pName,(char *)0x0);
  if (pMVar7 != (Mio_Gate_t *)pMVar3[cVar1].pMioGate) {
    __assert_fail("pGate == pCellB->pMioGate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                  ,0x2cd,
                  "int Sfm_LibImplementGatesArea(Sfm_Lib_t *, int *, int, int, Vec_Int_t *, Vec_Wec_t *)"
                 );
  }
  pMVar9 = pMVar3 + cVar2;
  iVar6 = Mio_GateReadValue(pMVar7);
  Vec_IntPush(vGates,iVar6);
  pVVar8 = Vec_WecPushLevel(vFanins);
  if (0xfffffff < *(uint *)&pMVar3[cVar1].field_0x10) {
    uVar10 = 0;
    do {
      lVar5 = uVar10 + 1;
      uVar10 = uVar10 + 1;
      Vec_IntPush(pVVar8,pFanins[pSVar4[iObj].pFansB[lVar5]]);
    } while (uVar10 < *(uint *)&pMVar3[cVar1].field_0x10 >> 0x1c);
  }
  if (pMVar9 == p->pCells) {
    iVar6 = 1;
  }
  else {
    pMVar7 = Mio_LibraryReadGateByName(pLib,pMVar9->pName,(char *)0x0);
    if (pMVar7 != (Mio_Gate_t *)pMVar9->pMioGate) {
      __assert_fail("pGate == pCellT->pMioGate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                    ,0x2d6,
                    "int Sfm_LibImplementGatesArea(Sfm_Lib_t *, int *, int, int, Vec_Int_t *, Vec_Wec_t *)"
                   );
    }
    iVar6 = Mio_GateReadValue(pMVar7);
    Vec_IntPush(vGates,iVar6);
    pVVar8 = Vec_WecPushLevel(vFanins);
    iVar6 = 2;
    if (0xfffffff < *(uint *)&pMVar9->field_0x10) {
      uVar10 = 0;
      do {
        if ((long)pSVar4[iObj].pFansT[uVar10 + 1] == 0x10) {
          iVar6 = vFanins->nSize + -2;
        }
        else {
          iVar6 = pFanins[pSVar4[iObj].pFansT[uVar10 + 1]];
        }
        uVar10 = uVar10 + 1;
        Vec_IntPush(pVVar8,iVar6);
      } while (uVar10 < *(uint *)&pMVar9->field_0x10 >> 0x1c);
      iVar6 = 2;
    }
  }
  return iVar6;
}

Assistant:

int Sfm_LibImplementGatesArea( Sfm_Lib_t * p, int * pFanins, int nFanins, int iObj, Vec_Int_t * vGates, Vec_Wec_t * vFanins )
{
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    Sfm_Fun_t * pObjMin = p->pObjs + iObj;
    Mio_Cell2_t * pCellB, * pCellT;
    Mio_Gate_t * pGate;
    Vec_Int_t * vLevel;
    int i;
    // get the gates
    pCellB = p->pCells + (int)pObjMin->pFansB[0];
    pCellT = p->pCells + (int)pObjMin->pFansT[0];
    // create bottom gate
    pGate = Mio_LibraryReadGateByName( pLib, pCellB->pName, NULL );
    assert( pGate == pCellB->pMioGate );
    Vec_IntPush( vGates, Mio_GateReadValue(pGate) );
    vLevel = Vec_WecPushLevel( vFanins );
    for ( i = 0; i < (int)pCellB->nFanins; i++ )
        Vec_IntPush( vLevel, pFanins[(int)pObjMin->pFansB[i+1]] );
    if ( pCellT == p->pCells )
        return 1;
    // create top gate
    pGate = Mio_LibraryReadGateByName( pLib, pCellT->pName, NULL );
    assert( pGate == pCellT->pMioGate );
    Vec_IntPush( vGates, Mio_GateReadValue(pGate) );
    vLevel = Vec_WecPushLevel( vFanins );
    for ( i = 0; i < (int)pCellT->nFanins; i++ )
        if ( pObjMin->pFansT[i+1] == (char)16 )
            Vec_IntPush( vLevel, Vec_WecSize(vFanins)-2 );
        else
            Vec_IntPush( vLevel, pFanins[(int)pObjMin->pFansT[i+1]] );
    return 2;
}